

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O2

void createDListR(DLNode **L,int *a,int n)

{
  DLNode *pDVar1;
  DLNode *pDVar2;
  ulong uVar3;
  ulong uVar4;
  
  pDVar1 = (DLNode *)malloc(0x18);
  *L = pDVar1;
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  pDVar1->prior = (DLNode *)0x0;
  pDVar1->next = (DLNode *)0x0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pDVar2 = (DLNode *)malloc(0x18);
    pDVar2->data = a[uVar4];
    pDVar1->next = pDVar2;
    pDVar2->prior = pDVar1;
    pDVar1 = pDVar2;
  }
  pDVar1->next = (DLNode *)0x0;
  return;
}

Assistant:

void createDListR(DLNode *&L, int a[], int n) { //尾插法建立双链表
    DLNode *s,*r;
    L = (DLNode*)malloc(sizeof(DLNode));
    L->prior = NULL;
    L->next = NULL;
    r = L;  //和单链表一样，r始终指向终端结点，此时头结点即终端结点
    for(int i = 0; i < n; ++i) {
        s = (DLNode*)malloc(sizeof(DLNode));  //创建新结点
        s->data = a[i];
        r->next = s;
        s->prior = r;
        r = s;
    }
    r->next = NULL;
}